

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::
DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
::Release(DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
          *this)

{
  ReferenceCounterValueType RVar1;
  anon_class_16_2_6cb51993 local_28;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> local_18;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> pDevice;
  DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  *this_local;
  
  pDevice.m_pObject = (RenderDeviceVkImpl *)this;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::RefCntAutoPtr(&local_18);
  local_28.this = this;
  local_28.pDevice = &local_18;
  RVar1 = RefCountedObject<Diligent::IDeviceMemoryVk>::
          Release<Diligent::DeviceObjectBase<Diligent::IDeviceMemoryVk,Diligent::RenderDeviceVkImpl,Diligent::DeviceMemoryDesc>::Release()::_lambda()_1_>
                    ((RefCountedObject<Diligent::IDeviceMemoryVk> *)this,&local_28);
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::~RefCntAutoPtr(&local_18);
  return RVar1;
}

Assistant:

Release() override final
    {
        // Render device owns allocators for all types of device objects,
        // so it must be destroyed after all device objects are released.
        // Consider the following scenario: an object A owns the last strong
        // reference to the device:
        //
        // 1. A::~A() completes
        // 2. A::~DeviceObjectBase() completes
        // 3. A::m_pDevice is released
        //       Render device is destroyed, all allocators are invalid
        // 4. RefCountersImpl::ObjectWrapperBase::DestroyObject() calls
        //    m_pAllocator->Free(m_pObject) - crash!

        RefCntAutoPtr<RenderDeviceImplType> pDevice;
        return TBase::Release(
            [&]() //
            {
                // We must keep the device alive while the object is being destroyed
                // Note that internal device objects do not keep strong reference to the device
                if (!m_bIsDeviceInternal)
                {
                    pDevice = m_pDevice;
                }
            });
    }